

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

stack<c4::yml::Parser::State,_16UL> * __thiscall
c4::yml::detail::stack<c4::yml::Parser::State,_16UL>::operator=
          (stack<c4::yml::Parser::State,_16UL> *this,stack<c4::yml::Parser::State,_16UL> *that)

{
  size_t sz;
  
  _cb(this,&that->m_callbacks);
  sz = that->m_size;
  reserve(this,sz);
  this->m_size = sz;
  _cp(this,that);
  return this;
}

Assistant:

stack& operator= (stack const& that) noexcept
    {
        _cb(that.m_callbacks);
        resize(that.m_size);
        _cp(&that);
        return *this;
    }